

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.cpp
# Opt level: O1

void __thiscall
LiteScript::_Type_CALLBACK::Load
          (_Type_CALLBACK *this,istream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  long *plVar1;
  Memory *pMVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  Memory *pMVar9;
  offset_in_Memory_to_subr in_R8;
  new_allocator<LiteScript::Namer> local_111;
  Callback *local_110;
  uint local_104;
  uint local_100;
  uint local_fc;
  Memory *local_f8;
  offset_in_Memory_to_subr local_f0;
  Memory *local_e8;
  undefined1 local_e0 [16];
  Variable local_d0;
  bool local_c0 [16];
  bool local_b0 [16];
  Namer local_a0;
  bool local_58;
  
  local_f8 = (Memory *)caller;
  local_f0 = in_R8;
  Object::Reassign(object,(Type *)_type_callback,0xb0);
  Callback::Callback((Callback *)object->data,object->memory);
  local_110 = (Callback *)object->data;
  cVar3 = std::istream::get();
  if (cVar3 == '\0') {
    pMVar2 = object->memory;
    uVar4 = std::istream::get();
    uVar6 = std::istream::get();
    uVar7 = std::istream::get();
    iVar5 = std::istream::get();
    Callback::Callback((Callback *)local_e0,pMVar2,
                       (uVar7 & 0xff) << 0x10 | iVar5 << 0x18 | (uVar6 & 0xff) << 8 | uVar4 & 0xff);
    Callback::operator=(local_110,(Callback *)local_e0);
  }
  else {
    local_e8 = object->memory;
    local_fc = std::istream::get();
    uVar4 = std::istream::get();
    local_100 = std::istream::get();
    iVar5 = std::istream::get();
    local_104 = std::istream::get();
    uVar6 = std::istream::get();
    uVar7 = std::istream::get();
    iVar8 = std::istream::get();
    Callback::Callback((Callback *)local_e0,local_e8,
                       (local_100 & 0xff) << 0x10 | iVar5 << 0x18 |
                       (uVar4 & 0xff) << 8 | local_fc & 0xff,
                       (uVar7 & 0xff) << 0x10 | iVar8 << 0x18 |
                       (uVar6 & 0xff) << 8 | local_104 & 0xff);
    Callback::operator=(local_110,(Callback *)local_e0);
  }
  if (local_58 == false) {
    __gnu_cxx::new_allocator<LiteScript::Namer>::destroy<LiteScript::Namer>(&local_111,&local_a0);
  }
  local_58 = true;
  if (local_b0[0] == false) {
    Variable::~Variable((Variable *)local_c0);
  }
  cVar3 = std::istream::get();
  if (cVar3 == '\x01') {
    pMVar2 = object->memory;
    plVar1 = (long *)((long)(pMVar2->arr)._M_elems + local_f0);
    pMVar9 = local_f8;
    if (((ulong)local_f8 & 1) != 0) {
      pMVar9 = *(Memory **)((long)(local_f8->arr)._M_elems + *plVar1 + -1);
    }
    uVar4 = (*(code *)pMVar9)(plVar1,stream);
    Memory::GetVariable((Nullable<LiteScript::Variable> *)local_e0,pMVar2,uVar4);
    Nullable<LiteScript::Variable>::operator=(&local_110->This,(Variable *)local_e0);
    if (local_d0.obj._0_1_ == false) {
      Variable::~Variable((Variable *)local_e0);
    }
  }
  cVar3 = std::istream::get();
  if (cVar3 == '\x01') {
    Namer::Load((Namer *)local_e0,(Namer *)stream,(istream *)object->memory,local_f8,local_f0);
    Nullable<LiteScript::Namer>::operator=(&local_110->nsp,(Namer *)local_e0);
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::~vector
              ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)local_b0);
    if (local_c0[0] == false) {
      Variable::~Variable(&local_d0);
    }
    local_c0[0] = true;
    Variable::~Variable((Variable *)local_e0);
  }
  return;
}

Assistant:

void LiteScript::_Type_CALLBACK::Load(std::istream &stream, Object &object, unsigned int (Memory::*caller)(std::istream&)) const {
    object.Reassign(Type::CALLBACK, sizeof(Callback));
    std::allocator<Callback> allocator;
    allocator.construct(&object.GetData<Callback>(), object.memory);
    Callback& C = object.GetData<Callback>();
    if (IStreamer::Read<unsigned char>(stream) == 0)
        C = Callback(object.memory, IStreamer::Read<unsigned int>(stream));
    else
        C = Callback(object.memory, IStreamer::Read<unsigned int>(stream), IStreamer::Read<unsigned int>(stream));
    if (IStreamer::Read<unsigned char>(stream) == 1)
        C.This = *object.memory.GetVariable((object.memory.*caller)(stream));
    if (IStreamer::Read<unsigned char>(stream) == 1)
        C.nsp = Namer::Load(stream, object.memory, caller);
}